

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_utf8_codepoint<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,region *reg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  long lVar5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  _Alloc_hider _Var6;
  uint_least32_t codepoint;
  string_type character;
  source_location src;
  string str;
  istringstream iss;
  uint local_50c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined1 local_4e8 [32];
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  pointer local_488;
  pointer pbStack_480;
  pointer local_478;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  error_info local_3b0;
  pointer local_358;
  size_type sStack_350;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  _Alloc_hider local_318;
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  pointer local_2f8;
  pointer pbStack_2f0;
  pointer local_2e8;
  pointer local_2d8;
  size_type sStack_2d0;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  pointer local_278;
  pointer pbStack_270;
  pointer local_268;
  long local_260 [3];
  uint auStack_248 [24];
  ios_base local_1e8 [264];
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  peVar4 = (reg->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    local_3d0._M_string_length = 0;
    local_3d0.field_2._M_local_buf[0] = '\0';
  }
  else {
    lVar5 = (long)(peVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_3d0,(detail *)(reg->first_ + lVar5),(uchar *)(lVar5 + reg->last_),in_RCX);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d0,1,
             0xffffffffffffffff);
  std::__cxx11::istringstream::istringstream((istringstream *)local_260,(string *)local_4e8,_S_in);
  if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
    operator_delete((void *)local_4e8._0_8_,CONCAT44(local_4e8._20_4_,local_4e8._16_4_) + 1);
  }
  *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) =
       *(uint *)((long)auStack_248 + *(long *)(local_260[0] + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<unsigned_int>((uint *)local_260);
  paVar2 = &local_508.field_2;
  local_508._M_string_length = 0;
  local_508.field_2._M_local_buf[0] = '\0';
  local_508._M_dataplus._M_p = (pointer)paVar2;
  if (0x7f < local_50c) {
    if (local_50c < 0x800) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 6) | 0xc0);
    }
    else if (local_50c < 0x10000) {
      if ((local_50c & 0xf800) == 0xd800) {
        source_location::source_location((source_location *)local_4e8,reg);
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0,
                   "toml::parse_utf8_codepoint: [0xD800, 0xDFFF] is not a valid UTF-8","");
        local_298._M_p = (pointer)&local_288;
        local_2a8 = local_4b8;
        uStack_2a4 = uStack_4b4;
        uStack_2a0 = uStack_4b0;
        uStack_29c = uStack_4ac;
        local_2b8 = local_4c8;
        uStack_2b4 = uStack_4c4;
        uStack_2b0 = uStack_4c0;
        uStack_2ac = uStack_4bc;
        local_2c8 = local_4e8._16_4_;
        uStack_2c4 = local_4e8._20_4_;
        uStack_2c0 = local_4e8._24_4_;
        uStack_2bc = local_4e8._28_4_;
        local_2d8 = (pointer)local_4e8._0_8_;
        sStack_2d0 = local_4e8._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p == &local_498) {
          local_288._8_8_ = local_498._8_8_;
        }
        else {
          local_298._M_p = local_4a8._M_p;
        }
        local_290 = local_4a0;
        local_4a0 = 0;
        local_498._M_local_buf[0] = '\0';
        local_278 = local_488;
        pbStack_270 = pbStack_480;
        local_268 = local_478;
        local_488 = (pointer)0x0;
        pbStack_480 = (pointer)0x0;
        local_478 = (pointer)0x0;
        local_4a8._M_p = (pointer)&local_498;
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"here","");
        make_error_info<>(&local_3b0,&local_3f0,(source_location *)&local_2d8,&local_410);
        err<toml::error_info>(&local_88,&local_3b0);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
        failure<toml::error_info>::~failure(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.suffix_._M_dataplus._M_p != &local_3b0.suffix_.field_2) {
          operator_delete(local_3b0.suffix_._M_dataplus._M_p,
                          local_3b0.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_3b0.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.title_._M_dataplus._M_p != &local_3b0.title_.field_2) {
          operator_delete(local_3b0.title_._M_dataplus._M_p,
                          local_3b0.title_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_2d8);
        local_430.field_2._M_allocated_capacity = local_3f0.field_2._M_allocated_capacity;
        _Var6._M_p = local_3f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
LAB_0037c70c:
          operator_delete(_Var6._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
LAB_0037c714:
        source_location::~source_location((source_location *)local_4e8);
        goto LAB_0037c203;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 0xc) | 0xe0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 6) & 0x3f | 0x80);
    }
    else {
      if (0x10ffff < local_50c) {
        source_location::source_location((source_location *)local_4e8,reg);
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_430,"toml::parse_utf8_codepoint: input codepoint is too large.",
                   "");
        local_318._M_p = (pointer)&local_308;
        local_328 = local_4b8;
        uStack_324 = uStack_4b4;
        uStack_320 = uStack_4b0;
        uStack_31c = uStack_4ac;
        local_338 = local_4c8;
        uStack_334 = uStack_4c4;
        uStack_330 = uStack_4c0;
        uStack_32c = uStack_4bc;
        local_348 = local_4e8._16_4_;
        uStack_344 = local_4e8._20_4_;
        uStack_340 = local_4e8._24_4_;
        uStack_33c = local_4e8._28_4_;
        local_358 = (pointer)local_4e8._0_8_;
        sStack_350 = local_4e8._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p == &local_498) {
          local_308._8_8_ = local_498._8_8_;
        }
        else {
          local_318._M_p = local_4a8._M_p;
        }
        local_310 = local_4a0;
        local_4a0 = 0;
        local_498._M_local_buf[0] = '\0';
        local_2f8 = local_488;
        pbStack_2f0 = pbStack_480;
        local_2e8 = local_478;
        local_488 = (pointer)0x0;
        pbStack_480 = (pointer)0x0;
        local_478 = (pointer)0x0;
        local_4a8._M_p = (pointer)&local_498;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_450,"must be in range [0x00, 0x10FFFF]","");
        make_error_info<>(&local_3b0,&local_430,(source_location *)&local_358,&local_450);
        err<toml::error_info>(&local_e0,&local_3b0);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
        failure<toml::error_info>::~failure(&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.suffix_._M_dataplus._M_p != &local_3b0.suffix_.field_2) {
          operator_delete(local_3b0.suffix_._M_dataplus._M_p,
                          local_3b0.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_3b0.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0.title_._M_dataplus._M_p != &local_3b0.title_.field_2) {
          operator_delete(local_3b0.title_._M_dataplus._M_p,
                          local_3b0.title_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location((source_location *)&local_358);
        _Var6._M_p = local_430._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) goto LAB_0037c70c;
        goto LAB_0037c714;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 0x12) | 0xf0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 0xc) & 0x3f | 0x80);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&local_508,(byte)(local_50c >> 6) & 0x3f | 0x80);
    }
    local_50c = (uint)((byte)local_50c & 0x3f | 0x80);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_508,(char)local_50c);
  ok<std::__cxx11::string&>(&local_470,(toml *)&local_508,v);
  __return_storage_ptr__->is_ok_ = true;
  paVar1 = &(__return_storage_ptr__->field_1).succ_.value.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_1 = paVar1;
  paVar3 = &local_470.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.value._M_dataplus._M_p == paVar3) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_470.value.field_2._M_allocated_capacity._1_7_,
                  local_470.value.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
         local_470.value.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         local_470.value._M_dataplus._M_p;
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
         CONCAT71(local_470.value.field_2._M_allocated_capacity._1_7_,
                  local_470.value.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->field_1).succ_.value._M_string_length = local_470.value._M_string_length;
  local_470.value._M_string_length = 0;
  local_470.value.field_2._M_local_buf[0] = '\0';
  local_470.value._M_dataplus._M_p = (pointer)paVar3;
LAB_0037c203:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                             local_508.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_260);
  std::ios_base::~ios_base(local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_utf8_codepoint(const region& reg)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    // assert(reg.as_lines().size() == 1); // XXX heavy check

    const auto str = reg.as_string();
    assert( ! str.empty());
    assert(str.front() == 'u' || str.front() == 'U' || str.front() == 'x');

    std::uint_least32_t codepoint;
    std::istringstream iss(str.substr(1));
    iss >> std::hex >> codepoint;

    const auto to_char = [](const std::uint_least32_t i) noexcept -> char_type {
        const auto uc = static_cast<unsigned char>(i & 0xFF);
        return cxx::bit_cast<char_type>(uc);
    };

    string_type character;
    if(codepoint < 0x80) // U+0000 ... U+0079 ; just an ASCII.
    {
        character += static_cast<char>(codepoint);
    }
    else if(codepoint < 0x800) //U+0080 ... U+07FF
    {
        // 110yyyyx 10xxxxxx; 0x3f == 0b0011'1111
        character += to_char(0xC0|(codepoint >> 6  ));
        character += to_char(0x80|(codepoint & 0x3F));
    }
    else if(codepoint < 0x10000) // U+0800...U+FFFF
    {
        if(0xD800 <= codepoint && codepoint <= 0xDFFF)
        {
            auto src = source_location(reg);
            return err(make_error_info("toml::parse_utf8_codepoint: "
                "[0xD800, 0xDFFF] is not a valid UTF-8",
                std::move(src), "here"));
        }
        assert(codepoint < 0xD800 || 0xDFFF < codepoint);
        // 1110yyyy 10yxxxxx 10xxxxxx
        character += to_char(0xE0| (codepoint >> 12));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else if(codepoint < 0x110000) // U+010000 ... U+10FFFF
    {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        character += to_char(0xF0| (codepoint >> 18));
        character += to_char(0x80|((codepoint >> 12) & 0x3F));
        character += to_char(0x80|((codepoint >> 6 ) & 0x3F));
        character += to_char(0x80|((codepoint      ) & 0x3F));
    }
    else // out of UTF-8 region
    {
        auto src = source_location(reg);
        return err(make_error_info("toml::parse_utf8_codepoint: "
            "input codepoint is too large.",
            std::move(src), "must be in range [0x00, 0x10FFFF]"));
    }
    return ok(character);
}